

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listbox_widget.cpp
# Opt level: O2

void listbox_method_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  long *plVar4;
  Am_Value_List list;
  Am_Object listitem;
  Am_Object item;
  
  Am_Object::Get_Owner(&item,(Am_Slot_Flags)self);
  Am_Object::Get_Owner((Am_Object *)&list,(Am_Slot_Flags)&item);
  Am_Object::Get_Owner(&listitem,(Am_Slot_Flags)&list);
  Am_Object::~Am_Object((Am_Object *)&list);
  Am_Object::~Am_Object(&item);
  Am_Object::Get_Owner((Am_Object *)&list,(Am_Slot_Flags)&listitem);
  pAVar3 = Am_Object::Get((Am_Object *)&list,Am_MULTIPLE_SELECTION,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  Am_Object::~Am_Object((Am_Object *)&list);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&listitem,0x172,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    Am_Object::Set(&listitem,0x172,!bVar1,0);
  }
  else {
    Am_Object::Get_Owner(&item,(Am_Slot_Flags)&listitem);
    pAVar3 = Am_Object::Get(&item,0x82,0);
    Am_Value_List::Am_Value_List(&list,pAVar3);
    Am_Object::~Am_Object(&item);
    item.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&list);
    bVar1 = false;
    while( true ) {
      bVar2 = Am_Value_List::Last(&list);
      if (bVar1 != false || bVar2) break;
      pAVar3 = Am_Value_List::Get(&list);
      Am_Object::operator=(&item,pAVar3);
      pAVar3 = Am_Object::Get(&item,0x172,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
      if (bVar1) {
        Am_Object::Set(&item,0x172,false,0);
      }
      Am_Value_List::Next(&list);
    }
    Am_Object::Set(&listitem,0x172,true,0);
    Am_Object::~Am_Object(&item);
    Am_Value_List::~Am_Value_List(&list);
  }
  Am_Object::Get_Owner((Am_Object *)&list,(Am_Slot_Flags)&listitem);
  pAVar3 = Am_Object::Get((Am_Object *)&list,Am_THIS,0);
  plVar4 = (long *)Am_Value::operator_cast_to_void_(pAVar3);
  (**(code **)(*plVar4 + 0x28))(plVar4);
  Am_Object::~Am_Object((Am_Object *)&list);
  Am_Object::Get_Owner((Am_Object *)&list,(Am_Slot_Flags)&listitem);
  pAVar3 = Am_Object::Get((Am_Object *)&list,0x172,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  Am_Object::~Am_Object((Am_Object *)&list);
  if (bVar1) {
    Am_Object::Get_Owner((Am_Object *)&list,(Am_Slot_Flags)&listitem);
    Am_Object::Set((Am_Object *)&list,0x172,false,0);
  }
  else {
    Am_Object::Get_Owner((Am_Object *)&list,(Am_Slot_Flags)&listitem);
    Am_Object::Set((Am_Object *)&list,0x172,true,0);
  }
  Am_Object::~Am_Object((Am_Object *)&list);
  Am_Object::~Am_Object(&listitem);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, listbox_method, (Am_Object self))
{
  // Get the selected listitem object
  // Owner-chain: interactor-command->interactor->rectangle->listitem-group
  Am_Object listitem = self.Get_Owner().Get_Owner().Get_Owner();

  /// Do we have to handle multiple selects?
  if (static_cast<bool>(listitem.Get_Owner().Get(Am_MULTIPLE_SELECTION)) ==
      true) {
    /// just toggle the select status
    if (static_cast<bool>(listitem.Get(Am_SELECTED)) == true) {
      listitem.Set(Am_SELECTED, false);
    } else {
      listitem.Set(Am_SELECTED, true);
    }
  } else {
    /// Get list of all listitems from listbox object
    Am_Value_List list = listitem.Get_Owner().Get(Am_GRAPHICAL_PARTS);
    Am_Object item;

    /// find the previous selected listitem
    bool test = true;
    for (list.Start(); (list.Last() == false) && (test == true); list.Next()) {
      item = list.Get();
      if (static_cast<bool>(item.Get(Am_SELECTED)) == true) {
        /// and deselect it
        item.Set(Am_SELECTED, false);
        test = false;
      }
    }

    /// set the new listitem as selected
    listitem.Set(Am_SELECTED, true);
  }

  /// and last but not least call the selectMethod through the ABC pointer!
  reinterpret_cast<Am_Listbox_ABC *>(
      static_cast<Am_Ptr>(listitem.Get_Owner().Get(Am_THIS)))
      ->selectMethod();

  /// change the flag of the listbox object so that all constraints/formulas are re-evaluated
  if (static_cast<bool>(listitem.Get_Owner().Get(Am_SELECTED)) == true) {
    listitem.Get_Owner().Set(Am_SELECTED, false);
  } else {
    listitem.Get_Owner().Set(Am_SELECTED, true);
  }

  return;
}